

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParsePI(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlType xVar2;
  xmlParserInputState xVar3;
  xmlParserInputPtr pxVar4;
  processingInstructionSAXFunc p_Var5;
  int iVar6;
  uint val;
  xmlCatalogAllow xVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  xmlChar *pxVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  bool bVar14;
  int l;
  int local_54;
  xmlChar *local_50;
  int local_44;
  ulong local_40;
  ulong local_38;
  
  xVar2 = ctxt->mlType;
  if (((xVar2 != XML_TYPE_XML) || (pxVar8 = ctxt->input->cur, *pxVar8 != '<')) || (pxVar8[1] != '?')
     ) {
    if (xVar2 != XML_TYPE_SML) {
      return;
    }
    if (*ctxt->input->cur != '?') {
      return;
    }
  }
  pxVar4 = ctxt->input;
  iVar6 = pxVar4->id;
  xVar3 = ctxt->instate;
  ctxt->instate = XML_PARSER_PI;
  pxVar8 = pxVar4->cur;
  pxVar4->cur = pxVar8 + (ulong)(xVar2 == XML_TYPE_XML) + 1;
  pxVar4->col = (uint)(xVar2 == XML_TYPE_XML) + pxVar4->col + 1;
  if (pxVar8[(ulong)(xVar2 == XML_TYPE_XML) + 1] == '\0') {
    xmlParserInputGrow(pxVar4,0xfa);
  }
  if (ctxt->progressive == 0) {
    pxVar4 = ctxt->input;
    if ((500 < (long)pxVar4->cur - (long)pxVar4->base) &&
       ((long)pxVar4->end - (long)pxVar4->cur < 500)) {
      xmlSHRINK(ctxt);
    }
  }
  pxVar8 = xmlParsePITarget(ctxt);
  if (pxVar8 == (xmlChar *)0x0) {
    xmlFatalErr(ctxt,XML_ERR_PI_NOT_STARTED,(char *)0x0);
LAB_001606a2:
    if (ctxt->instate == XML_PARSER_EOF) {
      return;
    }
  }
  else {
    if (ctxt->mlType == XML_TYPE_SML) {
      xVar1 = *ctxt->input->cur;
      if ((xVar1 == ';') || (xVar1 == '\n')) goto LAB_00160210;
    }
    else if ((ctxt->mlType == XML_TYPE_XML) &&
            ((pxVar9 = ctxt->input->cur, *pxVar9 == '?' && (pxVar9[1] == '>')))) {
LAB_00160210:
      if (iVar6 != ctxt->input->id) {
        xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                       "PI declaration doesn\'t start and stop in the same entity\n");
      }
      bVar14 = ctxt->mlType == XML_TYPE_XML;
      pxVar4 = ctxt->input;
      pxVar9 = pxVar4->cur;
      pxVar4->cur = pxVar9 + (ulong)bVar14 + 1;
      pxVar4->col = (uint)bVar14 + pxVar4->col + 1;
      if (pxVar9[(ulong)bVar14 + 1] == '\0') {
        xmlParserInputGrow(pxVar4,0xfa);
      }
      if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
         (p_Var5 = ctxt->sax->processingInstruction, p_Var5 != (processingInstructionSAXFunc)0x0)) {
        (*p_Var5)(ctxt->userData,pxVar8,(xmlChar *)0x0);
      }
      goto LAB_001606a2;
    }
    pxVar9 = (xmlChar *)(*xmlMallocAtomic)(100);
    if (pxVar9 == (xmlChar *)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
    }
    else {
      local_44 = iVar6;
      iVar6 = xmlSkipBlankChars(ctxt);
      if (iVar6 == 0) {
        xmlFatalErrMsgStr(ctxt,XML_ERR_SPACE_REQUIRED,"ParsePI: PI %s space expected\n",pxVar8);
      }
      local_50 = pxVar8;
      val = xmlCurrentChar(ctxt,&local_54);
      sVar12 = 100;
      local_40 = 0;
      uVar13 = 0;
      while (pxVar8 = local_50, pxVar10 = pxVar9, (int)val < 0x100) {
        if (((int)val < 0x20) && ((0xd < val || ((0x2600U >> (val & 0x1f) & 1) == 0))))
        goto LAB_0016055b;
LAB_00160369:
        if (ctxt->mlType != XML_TYPE_SML) {
          if ((ctxt->mlType == XML_TYPE_XML) && ((val != 0x3f || (ctxt->input->cur[1] != '>'))))
          goto LAB_001603ae;
          goto LAB_0016055b;
        }
        if ((val == 10) || (val == 0x3b)) goto LAB_0016055b;
LAB_001603ae:
        if (sVar12 <= uVar13 + 5) {
          sVar12 = sVar12 * 2;
          local_38 = uVar13;
          pxVar10 = (xmlChar *)(*xmlRealloc)(pxVar9,sVar12);
          uVar13 = local_38;
          if (pxVar10 == (xmlChar *)0x0) {
            xmlErrMemory(ctxt,(char *)0x0);
            (*xmlFree)(pxVar9);
            ctxt->instate = xVar3;
            return;
          }
        }
        if ((int)local_40 < 0x32) {
          uVar11 = (ulong)((int)local_40 + 1);
        }
        else {
          if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa))
          {
            xmlGROW(ctxt);
          }
          if (ctxt->instate == XML_PARSER_EOF) {
            (*xmlFree)(pxVar10);
            return;
          }
          uVar11 = 0;
          if ((10000000 < uVar13) && ((ctxt->options & 0x80000) == 0)) goto LAB_0016056d;
        }
        local_40 = uVar11;
        if (local_54 == 1) {
          pxVar10[uVar13] = (xmlChar)val;
          uVar13 = uVar13 + 1;
        }
        else {
          iVar6 = xmlCopyCharMultiByte(pxVar10 + uVar13,val);
          uVar13 = uVar13 + (long)iVar6;
        }
        pxVar4 = ctxt->input;
        if (*pxVar4->cur == '\n') {
          pxVar4->line = pxVar4->line + 1;
          pxVar4->col = 1;
        }
        else {
          pxVar4->col = pxVar4->col + 1;
        }
        pxVar4->cur = pxVar4->cur + local_54;
        val = xmlCurrentChar(ctxt,&local_54);
        pxVar9 = pxVar10;
        if (val == 0) {
          if (ctxt->progressive == 0) {
            pxVar4 = ctxt->input;
            if ((500 < (long)pxVar4->cur - (long)pxVar4->base) &&
               ((long)pxVar4->end - (long)pxVar4->cur < 500)) {
              xmlSHRINK(ctxt);
            }
          }
          if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa))
          {
            xmlGROW(ctxt);
          }
          val = xmlCurrentChar(ctxt,&local_54);
        }
      }
      if ((val - 0x10000 < 0x100000 || val - 0xe000 < 0x1ffe) || (int)val < 0xd800)
      goto LAB_00160369;
LAB_0016055b:
      if ((uVar13 < 0x989681) || ((ctxt->options & 0x80000) != 0)) {
        pxVar9[uVar13] = '\0';
        if ((val == 0x3f || ctxt->mlType != XML_TYPE_XML) &&
           (((ctxt->mlType != XML_TYPE_SML || (val == 10)) || (val == 0x3b)))) {
          if (local_44 != ctxt->input->id) {
            xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                           "PI declaration doesn\'t start and stop in the same entity\n");
          }
          pxVar4 = ctxt->input;
          pxVar10 = pxVar4->cur;
          pxVar4->cur = pxVar10 + 2;
          pxVar4->col = pxVar4->col + 2;
          if (pxVar10[2] == '\0') {
            xmlParserInputGrow(pxVar4,0xfa);
          }
          if ((((uint)xVar3 < 2) &&
              (iVar6 = xmlStrEqual(pxVar8,(xmlChar *)"oasis-xml-catalog"), iVar6 != 0)) &&
             (xVar7 = xmlCatalogGetDefaults(),
             (xVar7 & ~XML_CATA_ALLOW_GLOBAL) == XML_CATA_ALLOW_DOCUMENT)) {
            xmlParseCatalogPI(ctxt,pxVar9);
          }
          if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
             (p_Var5 = ctxt->sax->processingInstruction, p_Var5 != (processingInstructionSAXFunc)0x0
             )) {
            (*p_Var5)(ctxt->userData,pxVar8,pxVar9);
          }
        }
        else {
          xmlFatalErrMsgStr(ctxt,XML_ERR_PI_NOT_FINISHED,"ParsePI: PI %s never end ...\n",local_50);
        }
        (*xmlFree)(pxVar9);
        goto LAB_001606a2;
      }
LAB_0016056d:
      xmlFatalErrMsgStr(ctxt,XML_ERR_PI_NOT_FINISHED,"PI %s too big found",local_50);
      (*xmlFree)(pxVar10);
    }
  }
  ctxt->instate = xVar3;
  return;
}

Assistant:

void
xmlParsePI(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    size_t len = 0;
    size_t size = XML_PARSER_BUFFER_SIZE;
    int cur, l;
    const xmlChar *target;
    xmlParserInputState state;
    int count = 0;

    if (CMP2_MLI(CUR_PTR, '<', '?')) {
	int inputid = ctxt->input->id;
	state = ctxt->instate;
        ctxt->instate = XML_PARSER_PI;
	/*
	 * this is a Processing Instruction.
	 */
	SKIP_MLI(2);
	SHRINK;

	/*
	 * Parse the target name and check for special support like
	 * namespace.
	 */
        target = xmlParsePITarget(ctxt);
	if (target != NULL) {
	    if (   (ISXML && (RAW == '?') && (NXT(1) == '>'))
	        || (ISSML && ((RAW == '\n') || (RAW == ';')))) {
		if (inputid != ctxt->input->id) {
		    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                           "PI declaration doesn't start and stop in"
                                   " the same entity\n");
		}
		SKIP_MLI(2);

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, NULL);
		if (ctxt->instate != XML_PARSER_EOF)
		    ctxt->instate = state;
		return;
	    }
	    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
	    if (buf == NULL) {
		xmlErrMemory(ctxt, NULL);
		ctxt->instate = state;
		return;
	    }
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsgStr(ctxt, XML_ERR_SPACE_REQUIRED,
			  "ParsePI: PI %s space expected\n", target);
	    }
	    cur = CUR_CHAR(l);
	    while (IS_CHAR(cur) && /* checked */
		   (   (ISXML && ((cur != '?') || (NXT(1) != '>')))
		    || (ISSML && (cur != '\n') && (cur != ';')))) {
		if (len + 5 >= size) {
		    xmlChar *tmp;
                    size_t new_size = size * 2;
		    tmp = (xmlChar *) xmlRealloc(buf, new_size);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt, NULL);
			xmlFree(buf);
			ctxt->instate = state;
			return;
		    }
		    buf = tmp;
                    size = new_size;
		}
		count++;
		if (count > 50) {
		    GROW;
                    if (ctxt->instate == XML_PARSER_EOF) {
                        xmlFree(buf);
                        return;
                    }
		    count = 0;
                    if ((len > XML_MAX_TEXT_LENGTH) &&
                        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                        xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
                                          "PI %s too big found", target);
                        xmlFree(buf);
                        ctxt->instate = state;
                        return;
                    }
		}
		COPY_BUF(l,buf,len,cur);
		NEXTL(l);
		cur = CUR_CHAR(l);
		if (cur == 0) {
		    SHRINK;
		    GROW;
		    cur = CUR_CHAR(l);
		}
	    }
            if ((len > XML_MAX_TEXT_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
                                  "PI %s too big found", target);
                xmlFree(buf);
                ctxt->instate = state;
                return;
            }
	    buf[len] = 0;
	    if (   (ISXML && (cur != '?'))
	        || (ISSML && (cur != '\n') && (cur != ';'))) {
		xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
		      "ParsePI: PI %s never end ...\n", target);
	    } else {
		if (inputid != ctxt->input->id) {
		    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                           "PI declaration doesn't start and stop in"
                                   " the same entity\n");
		}
		SKIP(2);

#ifdef LIBXML_CATALOG_ENABLED
		if (((state == XML_PARSER_MISC) ||
	             (state == XML_PARSER_START)) &&
		    (xmlStrEqual(target, XML_CATALOG_PI))) {
		    xmlCatalogAllow allow = xmlCatalogGetDefaults();
		    if ((allow == XML_CATA_ALLOW_DOCUMENT) ||
			(allow == XML_CATA_ALLOW_ALL))
			xmlParseCatalogPI(ctxt, buf);
		}
#endif


		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, buf);
	    }
	    xmlFree(buf);
	} else {
	    xmlFatalErr(ctxt, XML_ERR_PI_NOT_STARTED, NULL);
	}
	if (ctxt->instate != XML_PARSER_EOF)
	    ctxt->instate = state;
    }
}